

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SaveIniSettingsToDisk(char *ini_filename)

{
  FILE *__s;
  FILE *f;
  undefined1 local_28 [8];
  ImVector<char> buf;
  ImGuiContext *g;
  char *ini_filename_local;
  
  buf.Data = &GImGui->Initialized;
  GImGui->SettingsDirtyTimer = 0.0;
  if (ini_filename != (char *)0x0) {
    ImVector<char>::ImVector((ImVector<char> *)local_28);
    SaveIniSettingsToMemory((ImVector<char> *)local_28);
    __s = (FILE *)ImFileOpen(ini_filename,"wt");
    if (__s != (FILE *)0x0) {
      fwrite((void *)buf._0_8_,1,(long)(int)local_28._0_4_,__s);
      fclose(__s);
    }
    ImVector<char>::~ImVector((ImVector<char> *)local_28);
  }
  return;
}

Assistant:

static void SaveIniSettingsToDisk(const char* ini_filename)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    if (!ini_filename)
        return;

    ImVector<char> buf;
    SaveIniSettingsToMemory(buf);

    FILE* f = ImFileOpen(ini_filename, "wt");
    if (!f)
        return;
    fwrite(buf.Data, sizeof(char), (size_t)buf.Size, f);
    fclose(f);
}